

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

double __thiscall llvm::detail::IEEEFloat::convertToDouble(IEEEFloat *this)

{
  fltSemantics *pfVar1;
  IEEEFloat *pIVar2;
  APInt api;
  IEEEFloat *local_18;
  Significand local_10;
  
  if (this->semantics == (fltSemantics *)semIEEEdouble) {
    bitcastToAPInt((IEEEFloat *)&local_18);
    pIVar2 = (IEEEFloat *)&local_18;
    if (0x40 < (uint)local_10.part._0_4_) {
      pIVar2 = local_18;
    }
    pfVar1 = pIVar2->semantics;
    APInt::~APInt((APInt *)&local_18);
    return (double)pfVar1;
  }
  __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEdouble && \"Float semantics are not IEEEdouble\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xbd4,"double llvm::detail::IEEEFloat::convertToDouble() const");
}

Assistant:

double IEEEFloat::convertToDouble() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEdouble &&
         "Float semantics are not IEEEdouble");
  APInt api = bitcastToAPInt();
  return api.bitsToDouble();
}